

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retArea.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkRetimeMinAreaOne(Abc_Ntk_t *pNtk,int fForward,int fVerbose)

{
  uint *puVar1;
  uint uVar2;
  undefined4 uVar3;
  long *plVar4;
  long lVar5;
  Vec_Ptr_t *pVVar6;
  Vec_Ptr_t *__ptr;
  Abc_Ntk_t *pAVar7;
  Abc_Obj_t *pObj;
  int iVar8;
  uint uVar9;
  long lVar10;
  uint *puVar11;
  void *pvVar12;
  Vec_Ptr_t *pVVar13;
  int *piVar14;
  Abc_Obj_t *pAVar15;
  Vec_Ptr_t *pVVar16;
  Vec_Ptr_t *pVVar17;
  void **ppvVar18;
  Vec_Ptr_t *vNodes;
  ulong uVar19;
  Abc_Obj_t *pAVar20;
  char *pcVar21;
  int Fill;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined8 extraout_RDX_12;
  undefined8 extraout_RDX_13;
  undefined8 extraout_RDX_14;
  undefined8 uVar22;
  uint uVar23;
  int iVar24;
  ulong uVar25;
  long lVar26;
  Abc_Obj_t *local_88;
  Abc_Ntk_t *local_70;
  Abc_Obj_t *local_58;
  
  if (fForward == 0) {
    pVVar13 = pNtk->vPis;
    if (0 < pVVar13->nSize) {
      lVar10 = 0;
      do {
        puVar11 = (uint *)((long)pVVar13->pArray[lVar10] + 0x14);
        *puVar11 = *puVar11 | 0x10;
        lVar10 = lVar10 + 1;
        pVVar13 = pNtk->vPis;
      } while (lVar10 < pVVar13->nSize);
    }
    pVVar13 = pNtk->vBoxes;
    if (0 < pVVar13->nSize) {
      lVar10 = 0;
      do {
        plVar4 = (long *)pVVar13->pArray[lVar10];
        if ((*(uint *)((long)plVar4 + 0x14) & 0xf) == 8) {
          *(uint *)((long)plVar4 + 0x14) = *(uint *)((long)plVar4 + 0x14) | 0x10;
          puVar11 = (uint *)(*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                      (long)*(int *)plVar4[6] * 8) + 0x14);
          *puVar11 = *puVar11 | 0x10;
        }
        lVar10 = lVar10 + 1;
        pVVar13 = pNtk->vBoxes;
      } while (lVar10 < pVVar13->nSize);
    }
    pVVar13 = pNtk->vPos;
    if (0 < pVVar13->nSize) {
      lVar10 = 0;
      do {
        Abc_NtkMarkCone_rec((Abc_Obj_t *)pVVar13->pArray[lVar10],0);
        lVar10 = lVar10 + 1;
        pVVar13 = pNtk->vPos;
      } while (lVar10 < pVVar13->nSize);
    }
  }
  else {
    pVVar13 = pNtk->vPos;
    if (0 < pVVar13->nSize) {
      lVar10 = 0;
      do {
        puVar11 = (uint *)((long)pVVar13->pArray[lVar10] + 0x14);
        *puVar11 = *puVar11 | 0x10;
        lVar10 = lVar10 + 1;
        pVVar13 = pNtk->vPos;
      } while (lVar10 < pVVar13->nSize);
    }
    pVVar13 = pNtk->vBoxes;
    if (0 < pVVar13->nSize) {
      lVar10 = 0;
      do {
        plVar4 = (long *)pVVar13->pArray[lVar10];
        if ((*(uint *)((long)plVar4 + 0x14) & 0xf) == 8) {
          *(uint *)((long)plVar4 + 0x14) = *(uint *)((long)plVar4 + 0x14) | 0x10;
          puVar11 = (uint *)(*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                      (long)*(int *)plVar4[4] * 8) + 0x14);
          *puVar11 = *puVar11 | 0x10;
        }
        lVar10 = lVar10 + 1;
        pVVar13 = pNtk->vBoxes;
      } while (lVar10 < pVVar13->nSize);
    }
    pVVar13 = pNtk->vPis;
    if (0 < pVVar13->nSize) {
      lVar10 = 0;
      do {
        Abc_NtkMarkCone_rec((Abc_Obj_t *)pVVar13->pArray[lVar10],1);
        lVar10 = lVar10 + 1;
        pVVar13 = pNtk->vPis;
      } while (lVar10 < pVVar13->nSize);
    }
    puVar11 = (uint *)malloc(0x10);
    puVar11[0] = 100;
    puVar11[1] = 0;
    pvVar12 = malloc(800);
    *(void **)(puVar11 + 2) = pvVar12;
    pVVar13 = pNtk->vObjs;
    if (0 < pVVar13->nSize) {
      lVar10 = 0;
      do {
        plVar4 = (long *)pVVar13->pArray[lVar10];
        if (((plVar4 != (long *)0x0) && ((*(byte *)((long)plVar4 + 0x14) & 0x10) != 0)) &&
           (0 < *(int *)((long)plVar4 + 0x1c))) {
          lVar26 = 0;
          do {
            lVar5 = *(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                             (long)*(int *)(plVar4[4] + lVar26 * 4) * 8);
            if ((*(byte *)(lVar5 + 0x14) & 0x10) == 0) {
              uVar9 = puVar11[1];
              uVar2 = *puVar11;
              if (uVar9 == uVar2) {
                if ((int)uVar2 < 0x10) {
                  if (*(void **)(puVar11 + 2) == (void *)0x0) {
                    pvVar12 = malloc(0x80);
                  }
                  else {
                    pvVar12 = realloc(*(void **)(puVar11 + 2),0x80);
                  }
                  uVar23 = 0x10;
                }
                else {
                  uVar23 = uVar2 * 2;
                  if ((int)uVar23 <= (int)uVar2) goto LAB_00450d80;
                  if (*(void **)(puVar11 + 2) == (void *)0x0) {
                    pvVar12 = malloc((ulong)uVar2 << 4);
                  }
                  else {
                    pvVar12 = realloc(*(void **)(puVar11 + 2),(ulong)uVar2 << 4);
                  }
                }
                *(void **)(puVar11 + 2) = pvVar12;
                *puVar11 = uVar23;
              }
LAB_00450d80:
              puVar11[1] = uVar9 + 1;
              *(long *)(*(long *)(puVar11 + 2) + (long)(int)uVar9 * 8) = lVar5;
            }
            lVar26 = lVar26 + 1;
          } while (lVar26 < *(int *)((long)plVar4 + 0x1c));
        }
        lVar10 = lVar10 + 1;
        pVVar13 = pNtk->vObjs;
      } while (lVar10 < pVVar13->nSize);
    }
    uVar9 = puVar11[1];
    if (0 < (long)(int)uVar9) {
      lVar10 = *(long *)(puVar11 + 2);
      lVar26 = 0;
      do {
        puVar1 = (uint *)(*(long *)(lVar10 + lVar26 * 8) + 0x14);
        *puVar1 = *puVar1 | 0x10;
        lVar26 = lVar26 + 1;
      } while ((int)uVar9 != lVar26);
    }
    if (*(void **)(puVar11 + 2) != (void *)0x0) {
      free(*(void **)(puVar11 + 2));
      puVar11[2] = 0;
      puVar11[3] = 0;
    }
    free(puVar11);
  }
  pVVar13 = Abc_NtkMaxFlow(pNtk,fForward,fVerbose);
  if (pNtk->nObjCounts[8] <= pVVar13->nSize) {
    local_70 = (Abc_Ntk_t *)0x0;
LAB_00451c9b:
    if (pVVar13->pArray != (void **)0x0) {
      free(pVVar13->pArray);
      pVVar13->pArray = (void **)0x0;
    }
    if (pVVar13 != (Vec_Ptr_t *)0x0) {
      free(pVVar13);
    }
    Abc_NtkCleanMarkA(pNtk);
    return local_70;
  }
  if (fForward == 0) {
    local_70 = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_SOP,1);
    uVar22 = extraout_RDX_05;
    if ((pNtk->vTravIds).pArray == (int *)0x0) {
      iVar8 = pNtk->vObjs->nSize;
      uVar19 = (long)iVar8 + 500;
      iVar24 = (int)uVar19;
      if ((pNtk->vTravIds).nCap < iVar24) {
        piVar14 = (int *)malloc(uVar19 * 4);
        (pNtk->vTravIds).pArray = piVar14;
        if (piVar14 == (int *)0x0) goto LAB_00451dd6;
        (pNtk->vTravIds).nCap = iVar24;
        uVar22 = extraout_RDX_06;
      }
      if (-500 < iVar8) {
        memset((pNtk->vTravIds).pArray,0,(uVar19 & 0xffffffff) << 2);
        uVar22 = extraout_RDX_07;
      }
      (pNtk->vTravIds).nSize = iVar24;
    }
    iVar8 = pNtk->nTravIds;
    pNtk->nTravIds = iVar8 + 1;
    if (0x3ffffffe < iVar8) goto LAB_00451db7;
    if (0 < pVVar13->nSize) {
      lVar10 = 0;
      do {
        plVar4 = (long *)pVVar13->pArray[lVar10];
        pAVar15 = Abc_NtkCreateObj(local_70,ABC_OBJ_PI);
        plVar4[8] = (long)pAVar15;
        lVar26 = *plVar4;
        uVar3 = *(undefined4 *)(lVar26 + 0xd8);
        iVar8 = (int)plVar4[2];
        Vec_IntFillExtra((Vec_Int_t *)(lVar26 + 0xe0),iVar8 + 1,Fill);
        if (((long)iVar8 < 0) || (*(int *)(lVar26 + 0xe4) <= iVar8)) goto LAB_00451cde;
        *(undefined4 *)(*(long *)(lVar26 + 0xe8) + (long)iVar8 * 4) = uVar3;
        lVar10 = lVar10 + 1;
        uVar22 = extraout_RDX_08;
      } while (lVar10 < pVVar13->nSize);
    }
    pVVar16 = pNtk->vBoxes;
    if (0 < pVVar16->nSize) {
      lVar10 = 0;
      do {
        plVar4 = (long *)pVVar16->pArray[lVar10];
        if ((*(uint *)((long)plVar4 + 0x14) & 0xf) == 8) {
          pAVar15 = Abc_NtkRetimeMinAreaConstructNtk_rec
                              (local_70,*(Abc_Obj_t **)
                                         (*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                         (long)*(int *)plVar4[4] * 8));
          pAVar20 = Abc_NtkCreateObj(local_70,ABC_OBJ_PO);
          Abc_ObjAddFanin(pAVar20,pAVar15);
          uVar22 = extraout_RDX_09;
        }
        lVar10 = lVar10 + 1;
        pVVar16 = pNtk->vBoxes;
      } while (lVar10 < pVVar16->nSize);
    }
    if (0 < pVVar13->nSize) {
      lVar10 = 0;
      do {
        lVar26 = *pVVar13->pArray[lVar10];
        iVar8 = *(int *)(lVar26 + 0xd8);
        iVar24 = (int)*(long *)((long)pVVar13->pArray[lVar10] + 0x10);
        Vec_IntFillExtra((Vec_Int_t *)(lVar26 + 0xe0),iVar24 + 1,(int)uVar22);
        if (((long)iVar24 < 0) || (*(int *)(lVar26 + 0xe4) <= iVar24)) goto LAB_00451cde;
        *(int *)(*(long *)(lVar26 + 0xe8) + (long)iVar24 * 4) = iVar8 + -1;
        lVar10 = lVar10 + 1;
        uVar22 = extraout_RDX_10;
      } while (lVar10 < pVVar13->nSize);
    }
    pVVar16 = pNtk->vBoxes;
    if (0 < pVVar16->nSize) {
      lVar10 = 0;
      do {
        plVar4 = (long *)pVVar16->pArray[lVar10];
        if ((*(uint *)((long)plVar4 + 0x14) & 0xf) == 8) {
          lVar26 = *plVar4;
          iVar8 = *(int *)(lVar26 + 0xd8);
          iVar24 = (int)plVar4[2];
          Vec_IntFillExtra((Vec_Int_t *)(lVar26 + 0xe0),iVar24 + 1,(int)uVar22);
          if (((long)iVar24 < 0) || (*(int *)(lVar26 + 0xe4) <= iVar24)) goto LAB_00451cde;
          *(int *)(*(long *)(lVar26 + 0xe8) + (long)iVar24 * 4) = iVar8 + -1;
          uVar22 = extraout_RDX_11;
        }
        lVar10 = lVar10 + 1;
        pVVar16 = pNtk->vBoxes;
      } while (lVar10 < pVVar16->nSize);
    }
    Abc_NtkAddDummyPiNames(local_70);
    Abc_NtkAddDummyPoNames(local_70);
    iVar8 = Abc_NtkCheck(local_70);
    if (iVar8 == 0) {
      fwrite("Abc_NtkRetimeMinAreaConstructNtk(): Network check has failed.\n",0x3e,1,_stdout);
    }
  }
  else {
    uVar22 = extraout_RDX;
    if ((pNtk->vTravIds).pArray == (int *)0x0) {
      iVar8 = pNtk->vObjs->nSize;
      uVar19 = (long)iVar8 + 500;
      iVar24 = (int)uVar19;
      if ((pNtk->vTravIds).nCap < iVar24) {
        piVar14 = (int *)malloc(uVar19 * 4);
        (pNtk->vTravIds).pArray = piVar14;
        if (piVar14 == (int *)0x0) {
LAB_00451dd6:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (pNtk->vTravIds).nCap = iVar24;
        uVar22 = extraout_RDX_00;
      }
      if (-500 < iVar8) {
        memset((pNtk->vTravIds).pArray,0,(uVar19 & 0xffffffff) << 2);
        uVar22 = extraout_RDX_01;
      }
      (pNtk->vTravIds).nSize = iVar24;
    }
    iVar8 = pNtk->nTravIds;
    pNtk->nTravIds = iVar8 + 1;
    if (0x3ffffffe < iVar8) {
LAB_00451db7:
      __assert_fail("p->nTravIds < (1<<30)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                    ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
    }
    pVVar16 = pNtk->vBoxes;
    if (0 < pVVar16->nSize) {
      lVar10 = 0;
      do {
        plVar4 = (long *)pVVar16->pArray[lVar10];
        if ((*(uint *)((long)plVar4 + 0x14) & 0xf) == 8) {
          lVar26 = *plVar4;
          plVar4[8] = (ulong)(plVar4[7] == 2);
          uVar3 = *(undefined4 *)(lVar26 + 0xd8);
          iVar8 = (int)plVar4[2];
          Vec_IntFillExtra((Vec_Int_t *)(lVar26 + 0xe0),iVar8 + 1,(int)uVar22);
          if (((long)iVar8 < 0) || (*(int *)(lVar26 + 0xe4) <= iVar8)) goto LAB_00451cde;
          *(undefined4 *)(*(long *)(lVar26 + 0xe8) + (long)iVar8 * 4) = uVar3;
          uVar22 = extraout_RDX_02;
        }
        lVar10 = lVar10 + 1;
        pVVar16 = pNtk->vBoxes;
      } while (lVar10 < pVVar16->nSize);
    }
    if (0 < pVVar13->nSize) {
      lVar10 = 0;
      do {
        Abc_NtkRetimeMinAreaInitValues_rec((Abc_Obj_t *)pVVar13->pArray[lVar10]);
        lVar10 = lVar10 + 1;
        uVar22 = extraout_RDX_03;
      } while (lVar10 < pVVar13->nSize);
    }
    pVVar16 = pNtk->vBoxes;
    local_70 = (Abc_Ntk_t *)0x1;
    if (0 < pVVar16->nSize) {
      lVar10 = 0;
      do {
        plVar4 = (long *)pVVar16->pArray[lVar10];
        if ((*(uint *)((long)plVar4 + 0x14) & 0xf) == 8) {
          lVar26 = *plVar4;
          iVar8 = *(int *)(lVar26 + 0xd8);
          iVar24 = (int)plVar4[2];
          Vec_IntFillExtra((Vec_Int_t *)(lVar26 + 0xe0),iVar24 + 1,(int)uVar22);
          if (((long)iVar24 < 0) || (*(int *)(lVar26 + 0xe4) <= iVar24)) goto LAB_00451cde;
          *(int *)(*(long *)(lVar26 + 0xe8) + (long)iVar24 * 4) = iVar8 + -1;
          uVar22 = extraout_RDX_04;
        }
        lVar10 = lVar10 + 1;
        pVVar16 = pNtk->vBoxes;
      } while (lVar10 < pVVar16->nSize);
    }
  }
  if (-1 < pNtk->nObjCounts[8]) {
    pVVar16 = pNtk->vCis;
    pVVar16->nSize = pVVar16->nSize - pNtk->nObjCounts[8];
    if (-1 < pNtk->nObjCounts[8]) {
      pVVar6 = pNtk->vCos;
      pVVar6->nSize = pVVar6->nSize - pNtk->nObjCounts[8];
      pNtk->vCis = (Vec_Ptr_t *)0x0;
      pNtk->vCos = (Vec_Ptr_t *)0x0;
      __ptr = pNtk->vBoxes;
      pNtk->vBoxes = (Vec_Ptr_t *)0x0;
      pVVar17 = (Vec_Ptr_t *)malloc(0x10);
      pVVar17->nCap = 100;
      pVVar17->nSize = 0;
      ppvVar18 = (void **)malloc(800);
      pVVar17->pArray = ppvVar18;
      if (0 < __ptr->nSize) {
        lVar10 = 0;
        do {
          pvVar12 = __ptr->pArray[lVar10];
          if ((*(uint *)((long)pvVar12 + 0x14) & 0xf) != 8) {
            uVar9 = pVVar17->nCap;
            if (pVVar17->nSize == uVar9) {
              if ((int)uVar9 < 0x10) {
                if (pVVar17->pArray == (void **)0x0) {
                  ppvVar18 = (void **)malloc(0x80);
                }
                else {
                  ppvVar18 = (void **)realloc(pVVar17->pArray,0x80);
                }
                iVar8 = 0x10;
              }
              else {
                iVar8 = uVar9 * 2;
                if (iVar8 <= (int)uVar9) goto LAB_0045143d;
                if (pVVar17->pArray == (void **)0x0) {
                  ppvVar18 = (void **)malloc((ulong)uVar9 << 4);
                }
                else {
                  ppvVar18 = (void **)realloc(pVVar17->pArray,(ulong)uVar9 << 4);
                }
              }
              pVVar17->pArray = ppvVar18;
              pVVar17->nCap = iVar8;
            }
LAB_0045143d:
            iVar8 = pVVar17->nSize;
            pVVar17->nSize = iVar8 + 1;
            pVVar17->pArray[iVar8] = pvVar12;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < __ptr->nSize);
      }
      vNodes = (Vec_Ptr_t *)malloc(0x10);
      vNodes->nCap = 100;
      vNodes->nSize = 0;
      ppvVar18 = (void **)malloc(800);
      vNodes->pArray = ppvVar18;
      puVar11 = (uint *)malloc(0x10);
      puVar11[0] = 100;
      puVar11[1] = 0;
      pvVar12 = malloc(800);
      *(void **)(puVar11 + 2) = pvVar12;
      if (0 < pVVar13->nSize) {
        lVar10 = 0;
        do {
          pAVar15 = (Abc_Obj_t *)pVVar13->pArray[lVar10];
          uVar9 = *(uint *)&pAVar15->field_0x14 & 0xf;
          if ((fForward == 0) || (uVar9 != 2 && uVar9 != 5)) {
            if ((fForward == 0) && (0xfffffffd < uVar9 - 5)) {
              local_58 = (Abc_Obj_t *)pAVar15->pNtk->vObjs->pArray[*(pAVar15->vFanouts).pArray];
              pAVar7 = local_58->pNtk;
              ppvVar18 = pAVar7->vObjs->pArray;
              pAVar20 = (Abc_Obj_t *)ppvVar18[*(local_58->vFanouts).pArray];
              if ((((*(uint *)&pAVar20->field_0x14 & 0xf) != 5) || (uVar9 != 4)) ||
                 ((*(uint *)&local_58->field_0x14 & 0xf) != 8)) {
                __assert_fail("Abc_ObjIsBo(pLatchOut) && Abc_ObjIsLatch(pLatch) && Abc_ObjIsBi(pLatchIn)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/ret/retArea.c"
                              ,0x1d3,
                              "void Abc_NtkRetimeMinAreaUpdateLatches(Abc_Ntk_t *, Vec_Ptr_t *, int)"
                             );
              }
              iVar8 = pAVar7->nTravIds;
              iVar24 = local_58->Id;
              Vec_IntFillExtra(&pAVar7->vTravIds,iVar24 + 1,(int)ppvVar18);
              if (((long)iVar24 < 0) || ((pAVar7->vTravIds).nSize <= iVar24)) goto LAB_00451cde;
              (pAVar7->vTravIds).pArray[iVar24] = iVar8;
              local_88 = pAVar15;
              if ((*(byte *)((long)pAVar15->pNtk->vObjs->pArray[*(pAVar15->vFanins).pArray] + 0x14)
                  & 0x10) != 0) {
                __assert_fail("!Abc_ObjFanin0(pLatchIn)->fMarkA",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/ret/retArea.c"
                              ,0x1d6,
                              "void Abc_NtkRetimeMinAreaUpdateLatches(Abc_Ntk_t *, Vec_Ptr_t *, int)"
                             );
              }
            }
            else {
              pAVar20 = Abc_NtkCreateObj(pNtk,ABC_OBJ_BO);
              local_58 = Abc_NtkCreateObj(pNtk,ABC_OBJ_LATCH);
              local_88 = Abc_NtkCreateObj(pNtk,ABC_OBJ_BI);
              pcVar21 = Abc_ObjName(local_58);
              Abc_ObjAssignName(pAVar20,pcVar21,"_out");
              pcVar21 = Abc_ObjName(local_58);
              Abc_ObjAssignName(local_88,pcVar21,"_in");
              Abc_ObjAddFanin(pAVar20,local_58);
              Abc_ObjAddFanin(local_58,local_88);
              if (fForward == 0) {
                Abc_NodeCollectFanouts(pAVar15,vNodes);
                if (0 < vNodes->nSize) {
                  lVar26 = 0;
                  do {
                    if ((((Abc_Obj_t *)vNodes->pArray[lVar26])->field_0x14 & 0x10) != 0) {
                      Abc_ObjPatchFanin((Abc_Obj_t *)vNodes->pArray[lVar26],pAVar15,pAVar20);
                    }
                    lVar26 = lVar26 + 1;
                  } while (lVar26 < vNodes->nSize);
                }
              }
              else {
                (local_58->field_5).pData =
                     (void *)(2 - (ulong)((pAVar15->field_6).pTemp == (void *)0x0));
                Abc_NodeCollectFanouts(pAVar15,vNodes);
                if (0 < vNodes->nSize) {
                  lVar26 = 0;
                  do {
                    if ((((Abc_Obj_t *)vNodes->pArray[lVar26])->field_0x14 & 0x10) == 0) {
                      Abc_ObjPatchFanin((Abc_Obj_t *)vNodes->pArray[lVar26],pAVar15,pAVar20);
                    }
                    lVar26 = lVar26 + 1;
                  } while (lVar26 < vNodes->nSize);
                }
              }
              Abc_ObjAddFanin(local_88,pAVar15);
            }
          }
          else {
            if ((uVar9 != 5) ||
               (local_58 = (Abc_Obj_t *)pAVar15->pNtk->vObjs->pArray[*(pAVar15->vFanins).pArray],
               (*(uint *)&local_58->field_0x14 & 0xf) != 8)) {
LAB_00451cfd:
              __assert_fail("Abc_ObjIsBo(pLatchOut) && Abc_ObjIsLatch(pLatch) && Abc_ObjIsBi(pLatchIn)"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/ret/retArea.c"
                            ,0x1b5,
                            "void Abc_NtkRetimeMinAreaUpdateLatches(Abc_Ntk_t *, Vec_Ptr_t *, int)")
              ;
            }
            pAVar7 = local_58->pNtk;
            local_88 = (Abc_Obj_t *)pAVar7->vObjs->pArray[*(local_58->vFanins).pArray];
            if ((*(uint *)&local_88->field_0x14 & 0xf) != 4) goto LAB_00451cfd;
            iVar8 = pAVar7->nTravIds;
            iVar24 = local_58->Id;
            Vec_IntFillExtra(&pAVar7->vTravIds,iVar24 + 1,(int)local_58);
            if (((long)iVar24 < 0) || ((pAVar7->vTravIds).nSize <= iVar24)) {
LAB_00451cde:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            (pAVar7->vTravIds).pArray[iVar24] = iVar8;
            uVar19 = (ulong)(pAVar15->vFanouts).nSize;
            if (0 < (long)uVar19) {
              piVar14 = (pAVar15->vFanouts).pArray;
              ppvVar18 = pAVar15->pNtk->vObjs->pArray;
              if ((*(byte *)((long)ppvVar18[*piVar14] + 0x14) & 0x10) == 0) {
                uVar25 = 0;
                do {
                  if (uVar19 - 1 == uVar25) goto LAB_0045191b;
                  lVar26 = uVar25 + 1;
                  uVar25 = uVar25 + 1;
                } while ((*(byte *)((long)ppvVar18[piVar14[lVar26]] + 0x14) & 0x10) == 0);
                if (uVar19 <= uVar25) goto LAB_0045191b;
              }
              pAVar20 = Abc_NtkCreateNodeBuf
                                  (pNtk,(Abc_Obj_t *)
                                        local_88->pNtk->vObjs->pArray[*(local_88->vFanins).pArray]);
              Abc_ObjPatchFanin(local_88,(Abc_Obj_t *)
                                         local_88->pNtk->vObjs->pArray[*(local_88->vFanins).pArray],
                                pAVar20);
              uVar9 = puVar11[1];
              uVar2 = *puVar11;
              if (uVar9 == uVar2) {
                if ((int)uVar2 < 0x10) {
                  if (*(void **)(puVar11 + 2) == (void *)0x0) {
                    pvVar12 = malloc(0x80);
                  }
                  else {
                    pvVar12 = realloc(*(void **)(puVar11 + 2),0x80);
                  }
                  uVar23 = 0x10;
                }
                else {
                  uVar23 = uVar2 * 2;
                  if ((int)uVar23 <= (int)uVar2) goto LAB_004518d4;
                  if (*(void **)(puVar11 + 2) == (void *)0x0) {
                    pvVar12 = malloc((ulong)uVar2 << 4);
                  }
                  else {
                    pvVar12 = realloc(*(void **)(puVar11 + 2),(ulong)uVar2 << 4);
                  }
                }
                *(void **)(puVar11 + 2) = pvVar12;
                *puVar11 = uVar23;
              }
LAB_004518d4:
              puVar11[1] = uVar9 + 1;
              *(Abc_Obj_t **)(*(long *)(puVar11 + 2) + (long)(int)uVar9 * 8) = pAVar20;
              Abc_NodeCollectFanouts(pAVar15,vNodes);
              if (0 < vNodes->nSize) {
                lVar26 = 0;
                do {
                  if ((((Abc_Obj_t *)vNodes->pArray[lVar26])->field_0x14 & 0x10) != 0) {
                    Abc_ObjPatchFanin((Abc_Obj_t *)vNodes->pArray[lVar26],pAVar15,pAVar20);
                  }
                  lVar26 = lVar26 + 1;
                } while (lVar26 < vNodes->nSize);
              }
            }
LAB_0045191b:
            pAVar20 = pAVar15;
            if ((pAVar15->vFanouts).nSize < 1) {
              __assert_fail("Abc_ObjFanoutNum(pObj) > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/ret/retArea.c"
                            ,0x1ca,
                            "void Abc_NtkRetimeMinAreaUpdateLatches(Abc_Ntk_t *, Vec_Ptr_t *, int)")
              ;
            }
          }
          uVar9 = pVVar16->nCap;
          if (pVVar16->nSize == uVar9) {
            if ((int)uVar9 < 0x10) {
              if (pVVar16->pArray == (void **)0x0) {
                ppvVar18 = (void **)malloc(0x80);
              }
              else {
                ppvVar18 = (void **)realloc(pVVar16->pArray,0x80);
              }
              iVar8 = 0x10;
            }
            else {
              iVar8 = uVar9 * 2;
              if (iVar8 <= (int)uVar9) goto LAB_00451988;
              if (pVVar16->pArray == (void **)0x0) {
                ppvVar18 = (void **)malloc((ulong)uVar9 << 4);
              }
              else {
                ppvVar18 = (void **)realloc(pVVar16->pArray,(ulong)uVar9 << 4);
              }
            }
            pVVar16->pArray = ppvVar18;
            pVVar16->nCap = iVar8;
          }
LAB_00451988:
          iVar8 = pVVar16->nSize;
          pVVar16->nSize = iVar8 + 1;
          pVVar16->pArray[iVar8] = pAVar20;
          uVar9 = pVVar17->nCap;
          if (pVVar17->nSize == uVar9) {
            if ((int)uVar9 < 0x10) {
              if (pVVar17->pArray == (void **)0x0) {
                ppvVar18 = (void **)malloc(0x80);
              }
              else {
                ppvVar18 = (void **)realloc(pVVar17->pArray,0x80);
              }
              iVar8 = 0x10;
            }
            else {
              iVar8 = uVar9 * 2;
              if (iVar8 <= (int)uVar9) goto LAB_00451a07;
              if (pVVar17->pArray == (void **)0x0) {
                ppvVar18 = (void **)malloc((ulong)uVar9 << 4);
              }
              else {
                ppvVar18 = (void **)realloc(pVVar17->pArray,(ulong)uVar9 << 4);
              }
            }
            pVVar17->pArray = ppvVar18;
            pVVar17->nCap = iVar8;
          }
LAB_00451a07:
          iVar8 = pVVar17->nSize;
          pVVar17->nSize = iVar8 + 1;
          pVVar17->pArray[iVar8] = local_58;
          uVar9 = pVVar6->nCap;
          if (pVVar6->nSize == uVar9) {
            if ((int)uVar9 < 0x10) {
              if (pVVar6->pArray == (void **)0x0) {
                ppvVar18 = (void **)malloc(0x80);
              }
              else {
                ppvVar18 = (void **)realloc(pVVar6->pArray,0x80);
              }
              iVar8 = 0x10;
            }
            else {
              iVar8 = uVar9 * 2;
              if (iVar8 <= (int)uVar9) goto LAB_00451a78;
              if (pVVar6->pArray == (void **)0x0) {
                ppvVar18 = (void **)malloc((ulong)uVar9 << 4);
              }
              else {
                ppvVar18 = (void **)realloc(pVVar6->pArray,(ulong)uVar9 << 4);
              }
            }
            pVVar6->pArray = ppvVar18;
            pVVar6->nCap = iVar8;
          }
LAB_00451a78:
          iVar8 = pVVar6->nSize;
          pVVar6->nSize = iVar8 + 1;
          pVVar6->pArray[iVar8] = local_88;
          lVar10 = lVar10 + 1;
        } while (lVar10 < pVVar13->nSize);
      }
      if (vNodes->pArray != (void **)0x0) {
        free(vNodes->pArray);
        vNodes->pArray = (void **)0x0;
      }
      free(vNodes);
      uVar9 = puVar11[1];
      if (0 < (long)(int)uVar9) {
        lVar10 = *(long *)(puVar11 + 2);
        lVar26 = 0;
        do {
          pAVar15 = *(Abc_Obj_t **)(lVar10 + lVar26 * 8);
          Abc_ObjTransferFanout
                    (pAVar15,(Abc_Obj_t *)pAVar15->pNtk->vObjs->pArray[*(pAVar15->vFanins).pArray]);
          Abc_NtkDeleteObj(pAVar15);
          lVar26 = lVar26 + 1;
        } while ((int)uVar9 != lVar26);
      }
      if (*(void **)(puVar11 + 2) != (void *)0x0) {
        free(*(void **)(puVar11 + 2));
        puVar11[2] = 0;
        puVar11[3] = 0;
      }
      free(puVar11);
      if (0 < __ptr->nSize) {
        lVar10 = 0;
        uVar22 = extraout_RDX_12;
        do {
          pAVar15 = (Abc_Obj_t *)__ptr->pArray[lVar10];
          if ((*(uint *)&pAVar15->field_0x14 & 0xf) == 8) {
            pAVar7 = pAVar15->pNtk;
            iVar8 = pAVar15->Id;
            Vec_IntFillExtra(&pAVar7->vTravIds,iVar8 + 1,(int)uVar22);
            if (((long)iVar8 < 0) || ((pAVar7->vTravIds).nSize <= iVar8)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar22 = extraout_RDX_13;
            if ((pAVar7->vTravIds).pArray[iVar8] != pAVar15->pNtk->nTravIds) {
              ppvVar18 = pAVar15->pNtk->vObjs->pArray;
              pAVar20 = (Abc_Obj_t *)ppvVar18[*(pAVar15->vFanouts).pArray];
              pObj = (Abc_Obj_t *)ppvVar18[*(pAVar15->vFanins).pArray];
              if (0 < (pAVar20->vFanouts).nSize) {
                Abc_ObjTransferFanout
                          (pAVar20,(Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray]);
              }
              Abc_NtkDeleteObj(pAVar20);
              Abc_NtkDeleteObj(pAVar15);
              Abc_NtkDeleteObj(pObj);
              uVar22 = extraout_RDX_14;
            }
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < __ptr->nSize);
      }
      pNtk->vCis = pVVar16;
      pNtk->vCos = pVVar6;
      pNtk->vBoxes = pVVar17;
      if (__ptr->pArray != (void **)0x0) {
        free(__ptr->pArray);
        __ptr->pArray = (void **)0x0;
      }
      if (__ptr != (Vec_Ptr_t *)0x0) {
        free(__ptr);
      }
      goto LAB_00451c9b;
    }
  }
  __assert_fail("p->nSize >= nSizeNew",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkRetimeMinAreaOne( Abc_Ntk_t * pNtk, int fForward, int fVerbose )
{ 
    Abc_Ntk_t * pNtkNew = NULL;
    Vec_Ptr_t * vMinCut;
    // mark current latches and TFI(POs)
    Abc_NtkRetimeMinAreaPrepare( pNtk, fForward );
    // run the maximum forward flow
    vMinCut = Abc_NtkMaxFlow( pNtk, fForward, fVerbose );
//    assert( Vec_PtrSize(vMinCut) <= Abc_NtkLatchNum(pNtk) );
    // create new latch boundary if there is improvement
    if ( Vec_PtrSize(vMinCut) < Abc_NtkLatchNum(pNtk) )
    {
        pNtkNew = (Abc_Ntk_t *)1;
        if ( fForward )
            Abc_NtkRetimeMinAreaInitValues( pNtk, vMinCut );
        else
            pNtkNew = Abc_NtkRetimeMinAreaConstructNtk( pNtk, vMinCut );
        Abc_NtkRetimeMinAreaUpdateLatches( pNtk, vMinCut, fForward );
    }
    // clean up
    Vec_PtrFree( vMinCut );
    Abc_NtkCleanMarkA( pNtk );
    return pNtkNew;
}